

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

PrintActionsLog * __thiscall PrintActionsLog::toString_abi_cxx11_(PrintActionsLog *this)

{
  ActionStatus AVar1;
  BaseAction *in_RSI;
  undefined1 local_70 [86];
  allocator local_1a;
  undefined1 local_19;
  PrintActionsLog *this_local;
  string *msg;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"log ",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  AVar1 = BaseAction::getStatus(in_RSI);
  if (AVar1 == COMPLETED) {
    std::__cxx11::string::append((char *)this);
  }
  else {
    AVar1 = BaseAction::getStatus(in_RSI);
    if (AVar1 == ERROR) {
      BaseAction::getErrorMsg_abi_cxx11_((BaseAction *)local_70);
      std::operator+(local_70 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Error:");
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
      std::__cxx11::string::append((char *)this);
    }
  }
  return this;
}

Assistant:

std::string PrintActionsLog::toString() const
{
    std::string msg("log ");
    if(getStatus() == ActionStatus::COMPLETED)
    {
        msg.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        msg.append("Error:" + getErrorMsg());
    }
    else msg.append("Pending");
    return msg;
}